

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O1

int lib_atoi_adv(char **str,size_t *len)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar2 = 1;
  if (*len == 0) goto LAB_0022bbd3;
  pcVar1 = *str;
  iVar3 = -1;
  if (*pcVar1 != '-') {
    if (*len == 0) goto LAB_0022bbd3;
    pcVar1 = *str;
    iVar3 = 1;
    if (*pcVar1 != '+') goto LAB_0022bbd3;
  }
  *str = pcVar1 + 1;
  *len = *len - 1;
  iVar2 = iVar3;
LAB_0022bbd3:
  if (*len == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      uVar4 = (int)**str - 0x30;
      if (9 < uVar4) break;
      iVar3 = uVar4 + iVar3 * 10;
      *str = *str + 1;
      *len = *len - 1;
    } while (*len != 0);
  }
  return iVar3 * iVar2;
}

Assistant:

int lib_atoi_adv(const char *&str, size_t &len)
{
    /* parse the sign, if present */
    int s = 1;
    if (len >= 1 && *str == '-')
        s = -1, ++str, --len;
    else if (len >= 1 && *str == '+')
        ++str, --len;

    /* scan digits */
    int acc;
    for (acc = 0 ; len > 0 && is_digit(*str) ;
         acc *= 10, acc += value_of_digit(*str), ++str, --len) ;

    /* apply the sign and return the result */
    return s * acc;
}